

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O2

int luaU_dump(lua_State *L,Proto *f,lua_Writer w,void *data,int strip)

{
  DumpState D;
  
  D.status = 0;
  D.L = L;
  D.writer = w;
  D.data = data;
  D.strip = strip;
  DumpBlock("\x1bRavi",5,&D);
  DumpByte(0x53,&D);
  DumpByte(1,&D);
  DumpBlock(anon_var_dwarf_1647e,6,&D);
  DumpByte(4,&D);
  DumpByte(8,&D);
  DumpByte(4,&D);
  DumpByte(8,&D);
  DumpByte(8,&D);
  DumpInteger(0x5678,&D);
  DumpNumber(370.5,&D);
  DumpByte(f->sizeupvalues,&D);
  DumpFunction(f,(TString *)0x0,&D);
  return D.status;
}

Assistant:

int luaU_dump(lua_State *L, const Proto *f, lua_Writer w, void *data,
              int strip) {
  DumpState D;
  D.L = L;
  D.writer = w;
  D.data = data;
  D.strip = strip;
  D.status = 0;
  DumpHeader(&D);
  DumpByte(f->sizeupvalues, &D);
  DumpFunction(f, NULL, &D);
  return D.status;
}